

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
CEDate::JD2GregorianVect(vector<double,_std::allocator<double>_> *__return_storage_ptr__,double jd)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  allocator<int> local_61;
  double local_60;
  undefined8 local_58;
  vector<int,_std::allocator<int>_> gregorian_date;
  vector<double,_std::allocator<double>_> full_gregorian_vect;
  
  gregorian_date.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_60 = jd;
  std::allocator<double>::allocator((allocator<double> *)&local_58);
  std::vector<double,_std::allocator<double>_>::vector
            (&full_gregorian_vect,4,(value_type_conflict *)&gregorian_date,
             (allocator<double> *)&local_58);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_58);
  local_58 = (value_type_conflict)((ulong)local_58._4_4_ << 0x20);
  std::allocator<int>::allocator(&local_61);
  std::vector<int,_std::allocator<int>_>::vector
            (&gregorian_date,3,(value_type_conflict2 *)&local_58,&local_61);
  __gnu_cxx::new_allocator<int>::~new_allocator((new_allocator<int> *)&local_61);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&gregorian_date,0);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&gregorian_date,1);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&gregorian_date,2);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&full_gregorian_vect,3);
  iVar1 = iauJd2cal(local_60,0,pvVar2,pvVar3,pvVar4,pvVar5);
  if (iVar1 == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&gregorian_date,0);
    local_60 = (double)*pvVar2;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&full_gregorian_vect,0);
    *pvVar5 = local_60;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&gregorian_date,1);
    local_60 = (double)*pvVar2;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&full_gregorian_vect,1);
    *pvVar5 = local_60;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&gregorian_date,2);
    local_60 = (double)*pvVar2;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&full_gregorian_vect,2);
    *pvVar5 = local_60;
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,&full_gregorian_vect);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "[WARNING] CEDate::JD2GregorianVect() :: Bad date (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_60);
    poVar6 = std::operator<<(poVar6,")!");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_58 = 0.0;
    std::allocator<double>::allocator((allocator<double> *)&local_61);
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,4,(value_type_conflict *)&local_58,
               (allocator<double> *)&local_61);
    __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_61);
  }
  std::vector<int,_std::allocator<int>_>::~vector(&gregorian_date);
  std::vector<double,_std::allocator<double>_>::~vector(&full_gregorian_vect);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> CEDate::JD2GregorianVect(double jd)
{
    std::vector<double> full_gregorian_vect(4,0.0) ;
    std::vector<int> gregorian_date(3,0.0) ;
    
    // Try to fill the gregorian_date vector
    if (iauJd2cal(jd, 0, &gregorian_date[0], &gregorian_date[1],
                   &gregorian_date[2], &full_gregorian_vect[3])) {
        std::cerr << "[WARNING] CEDate::JD2GregorianVect() :: Bad date (" << jd << ")!" << std::endl ;
        return std::vector<double>(4,0.0) ;
    } else {
        // Fill the double vector from the integer values
        full_gregorian_vect[0] = 1.0*gregorian_date[0] ;
        full_gregorian_vect[1] = 1.0*gregorian_date[1] ;
        full_gregorian_vect[2] = 1.0*gregorian_date[2] ;
    }
    
    return full_gregorian_vect ;
}